

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_info.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  string *__s1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  pointer pPVar4;
  char *in_RCX;
  string *format;
  pointer *this;
  pointer pPVar5;
  char *pcVar6;
  char *__end;
  ulong uVar7;
  bool bVar8;
  undefined1 local_180 [8];
  string hed_filename;
  string nam_filename;
  string local_130;
  undefined1 local_110 [8];
  string name_info;
  shared_ptr<mg::fs::MappedFile> mrg_data;
  undefined1 auStack_d8 [8];
  Nam nam;
  string compress_info;
  string mrg_filename;
  string hed_raw;
  string nam_raw;
  MappedMrg *local_38;
  
  if (argc < 2) {
LAB_00103832:
    main_cold_2();
    return -1;
  }
  uVar7 = 1;
  bVar2 = false;
  format = (string *)0x0;
  do {
    __s1 = (string *)argv[uVar7];
    iVar3 = strcmp((char *)__s1,"--csv");
    if (iVar3 == 0) {
      bVar2 = true;
    }
    else {
      bVar8 = format != (string *)0x0;
      format = __s1;
      if (bVar8) {
        main_cold_1();
        return -1;
      }
    }
    uVar7 = uVar7 + 1;
  } while ((uint)argc != uVar7);
  if (format == (string *)0x0) goto LAB_00103832;
  compress_info.field_2._8_8_ = &mrg_filename._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&compress_info.field_2 + 8),"%s.hed","");
  mg::string::format<char_const*>
            ((string *)local_180,(string *)(compress_info.field_2._M_local_buf + 8),format,in_RCX);
  if ((size_type *)compress_info.field_2._8_8_ != &mrg_filename._M_string_length) {
    operator_delete((void *)compress_info.field_2._8_8_,mrg_filename._M_string_length + 1);
  }
  psVar1 = &hed_raw._M_string_length;
  mrg_filename.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&mrg_filename.field_2 + 8),"%s.mrg","");
  mg::string::format<char_const*>
            ((string *)((long)&compress_info.field_2 + 8),
             (string *)(mrg_filename.field_2._M_local_buf + 8),format,in_RCX);
  if ((size_type *)mrg_filename.field_2._8_8_ != psVar1) {
    operator_delete((void *)mrg_filename.field_2._8_8_,
                    CONCAT71(hed_raw._M_string_length._1_7_,(undefined1)hed_raw._M_string_length) +
                    1);
  }
  hed_raw._M_dataplus._M_p = (pointer)0x0;
  hed_raw._M_string_length._0_1_ = 0;
  mrg_filename.field_2._8_8_ = psVar1;
  bVar8 = mg::fs::read_file((char *)local_180,(string *)((long)&mrg_filename.field_2 + 8));
  iVar3 = -1;
  if (!bVar8) goto LAB_00103b5f;
  mg::fs::MappedFile::open(hed_filename.field_2._M_local_buf + 8,(int)compress_info.field_2._8_8_);
  std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
            ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)
             (name_info.field_2._M_local_buf + 8),
             (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
             ((long)&hed_filename.field_2 + 8));
  std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
            ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
             ((long)&hed_filename.field_2 + 8));
  if (name_info.field_2._8_8_ != 0) {
    psVar1 = &nam_raw._M_string_length;
    hed_raw.field_2._8_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&hed_raw.field_2 + 8),"%s.nam","");
    mg::string::format<char_const*>
              ((string *)((long)&hed_filename.field_2 + 8),
               (string *)(hed_raw.field_2._M_local_buf + 8),format,in_RCX);
    if ((size_type *)hed_raw.field_2._8_8_ != psVar1) {
      operator_delete((void *)hed_raw.field_2._8_8_,
                      CONCAT71(nam_raw._M_string_length._1_7_,(undefined1)nam_raw._M_string_length)
                      + 1);
    }
    nam_raw._M_dataplus._M_p = (pointer)0x0;
    nam_raw._M_string_length._0_1_ = 0;
    nam.names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_d8 = (undefined1  [8])0x0;
    nam.names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    hed_raw.field_2._8_8_ = psVar1;
    bVar8 = mg::fs::read_file((char *)hed_filename.field_2._8_8_,
                              (string *)((long)&hed_raw.field_2 + 8));
    if (bVar8) {
      bVar8 = mg::data::nam_read((string *)((long)&hed_raw.field_2 + 8),(Nam *)auStack_d8);
      nam_raw.field_2._12_4_ = (undefined4)CONCAT71(extraout_var,bVar8);
    }
    else {
      nam_raw.field_2._12_4_ = 0;
    }
    nam_filename.field_2._8_8_ = name_info.field_2._8_8_;
    if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->_size =
             (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_size + 1;
        UNLOCK();
      }
      else {
        *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->_size =
             (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_size + 1;
      }
    }
    mg::data::MappedMrg::parse
              ((MappedMrg *)&local_38,(string *)((long)&mrg_filename.field_2 + 8),
               (shared_ptr<mg::fs::MappedFile> *)((long)&nam_filename.field_2 + 8));
    if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    }
    if (local_38 != (MappedMrg *)0x0) {
      if (nam_raw.field_2._M_local_buf[0xc] == '\0') {
        pPVar4 = (local_38->_entries).
                 super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar5 = (local_38->_entries).
                 super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
LAB_001038d6:
        if (pPVar5 == pPVar4) {
          iVar3 = 0;
        }
        else {
          psVar1 = &compress_info._M_string_length;
          uVar7 = 0;
          do {
            this = &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (nam_raw.field_2._M_local_buf[0xc] == '\0') {
              local_110 = (undefined1  [8])&name_info._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"","");
            }
            else {
              nam.names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)this,", Name: \'%s\'","");
              mg::string::format<char_const*>
                        ((string *)local_110,(string *)this,
                         (string *)(((pointer)((long)auStack_d8 + uVar7 * 0x20))->_M_dataplus)._M_p,
                         (char *)(uVar7 * 0x20));
              if (nam.names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar1) {
                operator_delete(nam.names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                compress_info._M_string_length + 1);
              }
            }
            pPVar4 = (local_38->_entries).
                     super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pPVar4[uVar7].size_sectors == pPVar4[uVar7].size_uncompressed_sectors) {
              nam.names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         &nam.names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,"","");
            }
            else {
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_130,", Uncompressed size 0x%08x sectors","");
              mg::string::format<unsigned_short>
                        ((string *)
                         &nam.names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_130,
                         (local_38->_entries).
                         super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7].size_uncompressed_sectors)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
            }
            pPVar4 = (local_38->_entries).
                     super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (bVar2) {
              pcVar6 = "";
              if (nam_raw.field_2._M_local_buf[0xc] != '\0') {
                pcVar6 = (((pointer)((long)auStack_d8 + uVar7 * 0x20))->_M_dataplus)._M_p;
              }
              printf("%u,0x%08x,0x%08x,0x%08x,%s\n",uVar7,(ulong)pPVar4[uVar7].offset,
                     (ulong)pPVar4[uVar7].size_sectors,
                     (ulong)pPVar4[uVar7].size_uncompressed_sectors,pcVar6);
            }
            else {
              printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n",uVar7,
                     (ulong)pPVar4[uVar7].offset,(ulong)pPVar4[uVar7].size_sectors,
                     nam.names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
            }
            if (nam.names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar1) {
              operator_delete(nam.names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              compress_info._M_string_length + 1);
            }
            if (local_110 != (undefined1  [8])&name_info._M_string_length) {
              operator_delete((void *)local_110,name_info._M_string_length + 1);
            }
            uVar7 = (ulong)((int)uVar7 + 1);
          } while (uVar7 < (ulong)((long)(local_38->_entries).
                                         super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_38->_entries).
                                         super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          iVar3 = 0;
        }
      }
      else {
        pPVar4 = (local_38->_entries).
                 super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar5 = (local_38->_entries).
                 super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)pPVar5 - (long)pPVar4 >> 3 ==
            (long)nam.names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_d8 >> 5)
        goto LAB_001038d6;
        fprintf(_stderr,"MRG entry count (%lu) does not match NAM entry count (%lu)\n");
        if (local_38 == (MappedMrg *)0x0) goto LAB_00103b0e;
      }
      std::default_delete<mg::data::MappedMrg>::operator()
                ((default_delete<mg::data::MappedMrg> *)&local_38,local_38);
    }
LAB_00103b0e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_d8);
    if ((size_type *)hed_raw.field_2._8_8_ != &nam_raw._M_string_length) {
      operator_delete((void *)hed_raw.field_2._8_8_,
                      CONCAT71(nam_raw._M_string_length._1_7_,(undefined1)nam_raw._M_string_length)
                      + 1);
    }
    if ((size_type *)hed_filename.field_2._8_8_ != &nam_filename._M_string_length) {
      operator_delete((void *)hed_filename.field_2._8_8_,nam_filename._M_string_length + 1);
    }
  }
  if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_00103b5f:
  if ((size_type *)mrg_filename.field_2._8_8_ != &hed_raw._M_string_length) {
    operator_delete((void *)mrg_filename.field_2._8_8_,
                    CONCAT71(hed_raw._M_string_length._1_7_,(undefined1)hed_raw._M_string_length) +
                    1);
  }
  if ((size_type *)compress_info.field_2._8_8_ != &mrg_filename._M_string_length) {
    operator_delete((void *)compress_info.field_2._8_8_,mrg_filename._M_string_length + 1);
  }
  if (local_180 != (undefined1  [8])&hed_filename._M_string_length) {
    operator_delete((void *)local_180,hed_filename._M_string_length + 1);
    return iVar3;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool csv = false;
  const char *input_basename = nullptr;

  for (int i = 1; i < argc; i++) {
    if (!strcmp(argv[i], "--csv")) {
      csv = true;
      continue;
    }
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }
    usage(argv[0]);
    return -1;
  }

  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed files
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Print some info
  for (unsigned i = 0; i < mrg->entries().size(); i++) {
    const std::string name_info =
        !has_nam ? ""
                 : mg::string::format(", Name: '%s'", nam.names[i].c_str());
    const bool is_compressed = mrg->entries()[i].size_sectors !=
                               mrg->entries()[i].size_uncompressed_sectors;
    const std::string compress_info =
        !is_compressed
            ? ""
            : mg::string::format(", Uncompressed size 0x%08x sectors",
                                 mrg->entries()[i].size_uncompressed_sectors);
    if (csv) {
      printf("%u,0x%08x,0x%08x,0x%08x,%s\n", i, mrg->entries()[i].offset,
             mrg->entries()[i].size_sectors,
             mrg->entries()[i].size_uncompressed_sectors,
             has_nam ? nam.names[i].c_str() : "");
    } else {
      printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n", i,
             mrg->entries()[i].offset, mrg->entries()[i].size_sectors,
             compress_info.c_str(), name_info.c_str());
    }
  }

  return 0;
}